

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.h
# Opt level: O1

int gladLoadVulkanUserPtr(VkPhysicalDevice physical_device,GLADuserptrloadfunc load,void *userptr)

{
  bool bVar1;
  VkResult VVar2;
  uint uVar3;
  int iVar4;
  VkExtensionProperties *__ptr;
  VkExtensionProperties *__ptr_00;
  size_t sVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  VkExtensionProperties *__src;
  uint32_t i;
  ulong uVar10;
  VkExtensionProperties *pVVar11;
  uint32_t instance_extension_count;
  uint32_t device_extension_count;
  uint32_t version;
  uint32_t local_388;
  uint32_t local_384;
  ulong local_380;
  ulong local_378;
  VkPhysicalDevice local_370;
  VkPhysicalDeviceProperties local_368;
  
  glad_vkEnumerateInstanceVersion =
       (PFN_vkEnumerateInstanceVersion)(*load)(userptr,"vkEnumerateInstanceVersion");
  if (glad_vkEnumerateInstanceVersion == (PFN_vkEnumerateInstanceVersion)0x0) {
    uVar7 = 0;
    uVar3 = 1;
  }
  else {
    VVar2 = (*glad_vkEnumerateInstanceVersion)(&local_368.apiVersion);
    uVar7 = 0;
    if (VVar2 == VK_SUCCESS) {
      uVar7 = local_368.apiVersion >> 0xc & 0x3ff;
    }
    uVar3 = 1;
    if (VVar2 == VK_SUCCESS) {
      uVar3 = local_368.apiVersion >> 0x16;
    }
  }
  if (glad_vkGetPhysicalDeviceProperties != (PFN_vkGetPhysicalDeviceProperties)0x0 &&
      physical_device != (VkPhysicalDevice)0x0) {
    (*glad_vkGetPhysicalDeviceProperties)(physical_device,&local_368);
    uVar3 = local_368.apiVersion >> 0x16;
    uVar7 = local_368.apiVersion >> 0xc & 0x3ff;
  }
  GLAD_VK_VERSION_1_0 = (int)(1 < uVar3);
  if (uVar3 == 1) {
    GLAD_VK_VERSION_1_0 = 1;
  }
  GLAD_VK_VERSION_1_1 = (uint)(1 < uVar3);
  if (uVar7 != 0) {
    GLAD_VK_VERSION_1_1 = GLAD_VK_VERSION_1_0;
  }
  iVar8 = uVar3 * 10000 + uVar7;
  if (iVar8 == 0) {
    return 0;
  }
  if (GLAD_VK_VERSION_1_0 != 0) {
    glad_vkAllocateCommandBuffers =
         (PFN_vkAllocateCommandBuffers)(*load)(userptr,"vkAllocateCommandBuffers");
    glad_vkAllocateDescriptorSets =
         (PFN_vkAllocateDescriptorSets)(*load)(userptr,"vkAllocateDescriptorSets");
    glad_vkAllocateMemory = (PFN_vkAllocateMemory)(*load)(userptr,"vkAllocateMemory");
    glad_vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)(*load)(userptr,"vkBeginCommandBuffer");
    glad_vkBindBufferMemory = (PFN_vkBindBufferMemory)(*load)(userptr,"vkBindBufferMemory");
    glad_vkBindImageMemory = (PFN_vkBindImageMemory)(*load)(userptr,"vkBindImageMemory");
    glad_vkCmdBeginQuery = (PFN_vkCmdBeginQuery)(*load)(userptr,"vkCmdBeginQuery");
    glad_vkCmdBeginRenderPass = (PFN_vkCmdBeginRenderPass)(*load)(userptr,"vkCmdBeginRenderPass");
    glad_vkCmdBindDescriptorSets =
         (PFN_vkCmdBindDescriptorSets)(*load)(userptr,"vkCmdBindDescriptorSets");
    glad_vkCmdBindIndexBuffer = (PFN_vkCmdBindIndexBuffer)(*load)(userptr,"vkCmdBindIndexBuffer");
    glad_vkCmdBindPipeline = (PFN_vkCmdBindPipeline)(*load)(userptr,"vkCmdBindPipeline");
    glad_vkCmdBindVertexBuffers =
         (PFN_vkCmdBindVertexBuffers)(*load)(userptr,"vkCmdBindVertexBuffers");
    glad_vkCmdBlitImage = (PFN_vkCmdBlitImage)(*load)(userptr,"vkCmdBlitImage");
    glad_vkCmdClearAttachments = (PFN_vkCmdClearAttachments)(*load)(userptr,"vkCmdClearAttachments")
    ;
    glad_vkCmdClearColorImage = (PFN_vkCmdClearColorImage)(*load)(userptr,"vkCmdClearColorImage");
    glad_vkCmdClearDepthStencilImage =
         (PFN_vkCmdClearDepthStencilImage)(*load)(userptr,"vkCmdClearDepthStencilImage");
    glad_vkCmdCopyBuffer = (PFN_vkCmdCopyBuffer)(*load)(userptr,"vkCmdCopyBuffer");
    glad_vkCmdCopyBufferToImage =
         (PFN_vkCmdCopyBufferToImage)(*load)(userptr,"vkCmdCopyBufferToImage");
    glad_vkCmdCopyImage = (PFN_vkCmdCopyImage)(*load)(userptr,"vkCmdCopyImage");
    glad_vkCmdCopyImageToBuffer =
         (PFN_vkCmdCopyImageToBuffer)(*load)(userptr,"vkCmdCopyImageToBuffer");
    glad_vkCmdCopyQueryPoolResults =
         (PFN_vkCmdCopyQueryPoolResults)(*load)(userptr,"vkCmdCopyQueryPoolResults");
    glad_vkCmdDispatch = (PFN_vkCmdDispatch)(*load)(userptr,"vkCmdDispatch");
    glad_vkCmdDispatchIndirect = (PFN_vkCmdDispatchIndirect)(*load)(userptr,"vkCmdDispatchIndirect")
    ;
    glad_vkCmdDraw = (PFN_vkCmdDraw)(*load)(userptr,"vkCmdDraw");
    glad_vkCmdDrawIndexed = (PFN_vkCmdDrawIndexed)(*load)(userptr,"vkCmdDrawIndexed");
    glad_vkCmdDrawIndexedIndirect =
         (PFN_vkCmdDrawIndexedIndirect)(*load)(userptr,"vkCmdDrawIndexedIndirect");
    glad_vkCmdDrawIndirect = (PFN_vkCmdDrawIndirect)(*load)(userptr,"vkCmdDrawIndirect");
    glad_vkCmdEndQuery = (PFN_vkCmdEndQuery)(*load)(userptr,"vkCmdEndQuery");
    glad_vkCmdEndRenderPass = (PFN_vkCmdEndRenderPass)(*load)(userptr,"vkCmdEndRenderPass");
    glad_vkCmdExecuteCommands = (PFN_vkCmdExecuteCommands)(*load)(userptr,"vkCmdExecuteCommands");
    glad_vkCmdFillBuffer = (PFN_vkCmdFillBuffer)(*load)(userptr,"vkCmdFillBuffer");
    glad_vkCmdNextSubpass = (PFN_vkCmdNextSubpass)(*load)(userptr,"vkCmdNextSubpass");
    glad_vkCmdPipelineBarrier = (PFN_vkCmdPipelineBarrier)(*load)(userptr,"vkCmdPipelineBarrier");
    glad_vkCmdPushConstants = (PFN_vkCmdPushConstants)(*load)(userptr,"vkCmdPushConstants");
    glad_vkCmdResetEvent = (PFN_vkCmdResetEvent)(*load)(userptr,"vkCmdResetEvent");
    glad_vkCmdResetQueryPool = (PFN_vkCmdResetQueryPool)(*load)(userptr,"vkCmdResetQueryPool");
    glad_vkCmdResolveImage = (PFN_vkCmdResolveImage)(*load)(userptr,"vkCmdResolveImage");
    glad_vkCmdSetBlendConstants =
         (PFN_vkCmdSetBlendConstants)(*load)(userptr,"vkCmdSetBlendConstants");
    glad_vkCmdSetDepthBias = (PFN_vkCmdSetDepthBias)(*load)(userptr,"vkCmdSetDepthBias");
    glad_vkCmdSetDepthBounds = (PFN_vkCmdSetDepthBounds)(*load)(userptr,"vkCmdSetDepthBounds");
    glad_vkCmdSetEvent = (PFN_vkCmdSetEvent)(*load)(userptr,"vkCmdSetEvent");
    glad_vkCmdSetLineWidth = (PFN_vkCmdSetLineWidth)(*load)(userptr,"vkCmdSetLineWidth");
    glad_vkCmdSetScissor = (PFN_vkCmdSetScissor)(*load)(userptr,"vkCmdSetScissor");
    glad_vkCmdSetStencilCompareMask =
         (PFN_vkCmdSetStencilCompareMask)(*load)(userptr,"vkCmdSetStencilCompareMask");
    glad_vkCmdSetStencilReference =
         (PFN_vkCmdSetStencilReference)(*load)(userptr,"vkCmdSetStencilReference");
    glad_vkCmdSetStencilWriteMask =
         (PFN_vkCmdSetStencilWriteMask)(*load)(userptr,"vkCmdSetStencilWriteMask");
    glad_vkCmdSetViewport = (PFN_vkCmdSetViewport)(*load)(userptr,"vkCmdSetViewport");
    glad_vkCmdUpdateBuffer = (PFN_vkCmdUpdateBuffer)(*load)(userptr,"vkCmdUpdateBuffer");
    glad_vkCmdWaitEvents = (PFN_vkCmdWaitEvents)(*load)(userptr,"vkCmdWaitEvents");
    glad_vkCmdWriteTimestamp = (PFN_vkCmdWriteTimestamp)(*load)(userptr,"vkCmdWriteTimestamp");
    glad_vkCreateBuffer = (PFN_vkCreateBuffer)(*load)(userptr,"vkCreateBuffer");
    glad_vkCreateBufferView = (PFN_vkCreateBufferView)(*load)(userptr,"vkCreateBufferView");
    glad_vkCreateCommandPool = (PFN_vkCreateCommandPool)(*load)(userptr,"vkCreateCommandPool");
    glad_vkCreateComputePipelines =
         (PFN_vkCreateComputePipelines)(*load)(userptr,"vkCreateComputePipelines");
    glad_vkCreateDescriptorPool =
         (PFN_vkCreateDescriptorPool)(*load)(userptr,"vkCreateDescriptorPool");
    glad_vkCreateDescriptorSetLayout =
         (PFN_vkCreateDescriptorSetLayout)(*load)(userptr,"vkCreateDescriptorSetLayout");
    glad_vkCreateDevice = (PFN_vkCreateDevice)(*load)(userptr,"vkCreateDevice");
    glad_vkCreateEvent = (PFN_vkCreateEvent)(*load)(userptr,"vkCreateEvent");
    glad_vkCreateFence = (PFN_vkCreateFence)(*load)(userptr,"vkCreateFence");
    glad_vkCreateFramebuffer = (PFN_vkCreateFramebuffer)(*load)(userptr,"vkCreateFramebuffer");
    glad_vkCreateGraphicsPipelines =
         (PFN_vkCreateGraphicsPipelines)(*load)(userptr,"vkCreateGraphicsPipelines");
    glad_vkCreateImage = (PFN_vkCreateImage)(*load)(userptr,"vkCreateImage");
    glad_vkCreateImageView = (PFN_vkCreateImageView)(*load)(userptr,"vkCreateImageView");
    glad_vkCreateInstance = (PFN_vkCreateInstance)(*load)(userptr,"vkCreateInstance");
    glad_vkCreatePipelineCache = (PFN_vkCreatePipelineCache)(*load)(userptr,"vkCreatePipelineCache")
    ;
    glad_vkCreatePipelineLayout =
         (PFN_vkCreatePipelineLayout)(*load)(userptr,"vkCreatePipelineLayout");
    glad_vkCreateQueryPool = (PFN_vkCreateQueryPool)(*load)(userptr,"vkCreateQueryPool");
    glad_vkCreateRenderPass = (PFN_vkCreateRenderPass)(*load)(userptr,"vkCreateRenderPass");
    glad_vkCreateSampler = (PFN_vkCreateSampler)(*load)(userptr,"vkCreateSampler");
    glad_vkCreateSemaphore = (PFN_vkCreateSemaphore)(*load)(userptr,"vkCreateSemaphore");
    glad_vkCreateShaderModule = (PFN_vkCreateShaderModule)(*load)(userptr,"vkCreateShaderModule");
    glad_vkDestroyBuffer = (PFN_vkDestroyBuffer)(*load)(userptr,"vkDestroyBuffer");
    glad_vkDestroyBufferView = (PFN_vkDestroyBufferView)(*load)(userptr,"vkDestroyBufferView");
    glad_vkDestroyCommandPool = (PFN_vkDestroyCommandPool)(*load)(userptr,"vkDestroyCommandPool");
    glad_vkDestroyDescriptorPool =
         (PFN_vkDestroyDescriptorPool)(*load)(userptr,"vkDestroyDescriptorPool");
    glad_vkDestroyDescriptorSetLayout =
         (PFN_vkDestroyDescriptorSetLayout)(*load)(userptr,"vkDestroyDescriptorSetLayout");
    glad_vkDestroyDevice = (PFN_vkDestroyDevice)(*load)(userptr,"vkDestroyDevice");
    glad_vkDestroyEvent = (PFN_vkDestroyEvent)(*load)(userptr,"vkDestroyEvent");
    glad_vkDestroyFence = (PFN_vkDestroyFence)(*load)(userptr,"vkDestroyFence");
    glad_vkDestroyFramebuffer = (PFN_vkDestroyFramebuffer)(*load)(userptr,"vkDestroyFramebuffer");
    glad_vkDestroyImage = (PFN_vkDestroyImage)(*load)(userptr,"vkDestroyImage");
    glad_vkDestroyImageView = (PFN_vkDestroyImageView)(*load)(userptr,"vkDestroyImageView");
    glad_vkDestroyInstance = (PFN_vkDestroyInstance)(*load)(userptr,"vkDestroyInstance");
    glad_vkDestroyPipeline = (PFN_vkDestroyPipeline)(*load)(userptr,"vkDestroyPipeline");
    glad_vkDestroyPipelineCache =
         (PFN_vkDestroyPipelineCache)(*load)(userptr,"vkDestroyPipelineCache");
    glad_vkDestroyPipelineLayout =
         (PFN_vkDestroyPipelineLayout)(*load)(userptr,"vkDestroyPipelineLayout");
    glad_vkDestroyQueryPool = (PFN_vkDestroyQueryPool)(*load)(userptr,"vkDestroyQueryPool");
    glad_vkDestroyRenderPass = (PFN_vkDestroyRenderPass)(*load)(userptr,"vkDestroyRenderPass");
    glad_vkDestroySampler = (PFN_vkDestroySampler)(*load)(userptr,"vkDestroySampler");
    glad_vkDestroySemaphore = (PFN_vkDestroySemaphore)(*load)(userptr,"vkDestroySemaphore");
    glad_vkDestroyShaderModule = (PFN_vkDestroyShaderModule)(*load)(userptr,"vkDestroyShaderModule")
    ;
    glad_vkDeviceWaitIdle = (PFN_vkDeviceWaitIdle)(*load)(userptr,"vkDeviceWaitIdle");
    glad_vkEndCommandBuffer = (PFN_vkEndCommandBuffer)(*load)(userptr,"vkEndCommandBuffer");
    glad_vkEnumerateDeviceExtensionProperties =
         (PFN_vkEnumerateDeviceExtensionProperties)
         (*load)(userptr,"vkEnumerateDeviceExtensionProperties");
    glad_vkEnumerateDeviceLayerProperties =
         (PFN_vkEnumerateDeviceLayerProperties)(*load)(userptr,"vkEnumerateDeviceLayerProperties");
    glad_vkEnumerateInstanceExtensionProperties =
         (PFN_vkEnumerateInstanceExtensionProperties)
         (*load)(userptr,"vkEnumerateInstanceExtensionProperties");
    glad_vkEnumerateInstanceLayerProperties =
         (PFN_vkEnumerateInstanceLayerProperties)
         (*load)(userptr,"vkEnumerateInstanceLayerProperties");
    glad_vkEnumeratePhysicalDevices =
         (PFN_vkEnumeratePhysicalDevices)(*load)(userptr,"vkEnumeratePhysicalDevices");
    glad_vkFlushMappedMemoryRanges =
         (PFN_vkFlushMappedMemoryRanges)(*load)(userptr,"vkFlushMappedMemoryRanges");
    glad_vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)(*load)(userptr,"vkFreeCommandBuffers");
    glad_vkFreeDescriptorSets = (PFN_vkFreeDescriptorSets)(*load)(userptr,"vkFreeDescriptorSets");
    glad_vkFreeMemory = (PFN_vkFreeMemory)(*load)(userptr,"vkFreeMemory");
    glad_vkGetBufferMemoryRequirements =
         (PFN_vkGetBufferMemoryRequirements)(*load)(userptr,"vkGetBufferMemoryRequirements");
    glad_vkGetDeviceMemoryCommitment =
         (PFN_vkGetDeviceMemoryCommitment)(*load)(userptr,"vkGetDeviceMemoryCommitment");
    glad_vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)(*load)(userptr,"vkGetDeviceProcAddr");
    glad_vkGetDeviceQueue = (PFN_vkGetDeviceQueue)(*load)(userptr,"vkGetDeviceQueue");
    glad_vkGetEventStatus = (PFN_vkGetEventStatus)(*load)(userptr,"vkGetEventStatus");
    glad_vkGetFenceStatus = (PFN_vkGetFenceStatus)(*load)(userptr,"vkGetFenceStatus");
    glad_vkGetImageMemoryRequirements =
         (PFN_vkGetImageMemoryRequirements)(*load)(userptr,"vkGetImageMemoryRequirements");
    glad_vkGetImageSparseMemoryRequirements =
         (PFN_vkGetImageSparseMemoryRequirements)
         (*load)(userptr,"vkGetImageSparseMemoryRequirements");
    glad_vkGetImageSubresourceLayout =
         (PFN_vkGetImageSubresourceLayout)(*load)(userptr,"vkGetImageSubresourceLayout");
    glad_vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)(*load)(userptr,"vkGetInstanceProcAddr")
    ;
    glad_vkGetPhysicalDeviceFeatures =
         (PFN_vkGetPhysicalDeviceFeatures)(*load)(userptr,"vkGetPhysicalDeviceFeatures");
    glad_vkGetPhysicalDeviceFormatProperties =
         (PFN_vkGetPhysicalDeviceFormatProperties)
         (*load)(userptr,"vkGetPhysicalDeviceFormatProperties");
    glad_vkGetPhysicalDeviceImageFormatProperties =
         (PFN_vkGetPhysicalDeviceImageFormatProperties)
         (*load)(userptr,"vkGetPhysicalDeviceImageFormatProperties");
    glad_vkGetPhysicalDeviceMemoryProperties =
         (PFN_vkGetPhysicalDeviceMemoryProperties)
         (*load)(userptr,"vkGetPhysicalDeviceMemoryProperties");
    glad_vkGetPhysicalDeviceProperties =
         (PFN_vkGetPhysicalDeviceProperties)(*load)(userptr,"vkGetPhysicalDeviceProperties");
    glad_vkGetPhysicalDeviceQueueFamilyProperties =
         (PFN_vkGetPhysicalDeviceQueueFamilyProperties)
         (*load)(userptr,"vkGetPhysicalDeviceQueueFamilyProperties");
    glad_vkGetPhysicalDeviceSparseImageFormatProperties =
         (PFN_vkGetPhysicalDeviceSparseImageFormatProperties)
         (*load)(userptr,"vkGetPhysicalDeviceSparseImageFormatProperties");
    glad_vkGetPipelineCacheData =
         (PFN_vkGetPipelineCacheData)(*load)(userptr,"vkGetPipelineCacheData");
    glad_vkGetQueryPoolResults = (PFN_vkGetQueryPoolResults)(*load)(userptr,"vkGetQueryPoolResults")
    ;
    glad_vkGetRenderAreaGranularity =
         (PFN_vkGetRenderAreaGranularity)(*load)(userptr,"vkGetRenderAreaGranularity");
    glad_vkInvalidateMappedMemoryRanges =
         (PFN_vkInvalidateMappedMemoryRanges)(*load)(userptr,"vkInvalidateMappedMemoryRanges");
    glad_vkMapMemory = (PFN_vkMapMemory)(*load)(userptr,"vkMapMemory");
    glad_vkMergePipelineCaches = (PFN_vkMergePipelineCaches)(*load)(userptr,"vkMergePipelineCaches")
    ;
    glad_vkQueueBindSparse = (PFN_vkQueueBindSparse)(*load)(userptr,"vkQueueBindSparse");
    glad_vkQueueSubmit = (PFN_vkQueueSubmit)(*load)(userptr,"vkQueueSubmit");
    glad_vkQueueWaitIdle = (PFN_vkQueueWaitIdle)(*load)(userptr,"vkQueueWaitIdle");
    glad_vkResetCommandBuffer = (PFN_vkResetCommandBuffer)(*load)(userptr,"vkResetCommandBuffer");
    glad_vkResetCommandPool = (PFN_vkResetCommandPool)(*load)(userptr,"vkResetCommandPool");
    glad_vkResetDescriptorPool = (PFN_vkResetDescriptorPool)(*load)(userptr,"vkResetDescriptorPool")
    ;
    glad_vkResetEvent = (PFN_vkResetEvent)(*load)(userptr,"vkResetEvent");
    glad_vkResetFences = (PFN_vkResetFences)(*load)(userptr,"vkResetFences");
    glad_vkSetEvent = (PFN_vkSetEvent)(*load)(userptr,"vkSetEvent");
    glad_vkUnmapMemory = (PFN_vkUnmapMemory)(*load)(userptr,"vkUnmapMemory");
    glad_vkUpdateDescriptorSets =
         (PFN_vkUpdateDescriptorSets)(*load)(userptr,"vkUpdateDescriptorSets");
    glad_vkWaitForFences = (PFN_vkWaitForFences)(*load)(userptr,"vkWaitForFences");
  }
  if (GLAD_VK_VERSION_1_1 != 0) {
    glad_vkBindBufferMemory2 = (PFN_vkBindBufferMemory2)(*load)(userptr,"vkBindBufferMemory2");
    glad_vkBindImageMemory2 = (PFN_vkBindImageMemory2)(*load)(userptr,"vkBindImageMemory2");
    glad_vkCmdDispatchBase = (PFN_vkCmdDispatchBase)(*load)(userptr,"vkCmdDispatchBase");
    glad_vkCmdSetDeviceMask = (PFN_vkCmdSetDeviceMask)(*load)(userptr,"vkCmdSetDeviceMask");
    glad_vkCreateDescriptorUpdateTemplate =
         (PFN_vkCreateDescriptorUpdateTemplate)(*load)(userptr,"vkCreateDescriptorUpdateTemplate");
    glad_vkCreateSamplerYcbcrConversion =
         (PFN_vkCreateSamplerYcbcrConversion)(*load)(userptr,"vkCreateSamplerYcbcrConversion");
    glad_vkDestroyDescriptorUpdateTemplate =
         (PFN_vkDestroyDescriptorUpdateTemplate)(*load)(userptr,"vkDestroyDescriptorUpdateTemplate")
    ;
    glad_vkDestroySamplerYcbcrConversion =
         (PFN_vkDestroySamplerYcbcrConversion)(*load)(userptr,"vkDestroySamplerYcbcrConversion");
    glad_vkEnumerateInstanceVersion =
         (PFN_vkEnumerateInstanceVersion)(*load)(userptr,"vkEnumerateInstanceVersion");
    glad_vkEnumeratePhysicalDeviceGroups =
         (PFN_vkEnumeratePhysicalDeviceGroups)(*load)(userptr,"vkEnumeratePhysicalDeviceGroups");
    glad_vkGetBufferMemoryRequirements2 =
         (PFN_vkGetBufferMemoryRequirements2)(*load)(userptr,"vkGetBufferMemoryRequirements2");
    glad_vkGetDescriptorSetLayoutSupport =
         (PFN_vkGetDescriptorSetLayoutSupport)(*load)(userptr,"vkGetDescriptorSetLayoutSupport");
    glad_vkGetDeviceGroupPeerMemoryFeatures =
         (PFN_vkGetDeviceGroupPeerMemoryFeatures)
         (*load)(userptr,"vkGetDeviceGroupPeerMemoryFeatures");
    glad_vkGetDeviceQueue2 = (PFN_vkGetDeviceQueue2)(*load)(userptr,"vkGetDeviceQueue2");
    glad_vkGetImageMemoryRequirements2 =
         (PFN_vkGetImageMemoryRequirements2)(*load)(userptr,"vkGetImageMemoryRequirements2");
    glad_vkGetImageSparseMemoryRequirements2 =
         (PFN_vkGetImageSparseMemoryRequirements2)
         (*load)(userptr,"vkGetImageSparseMemoryRequirements2");
    glad_vkGetPhysicalDeviceExternalBufferProperties =
         (PFN_vkGetPhysicalDeviceExternalBufferProperties)
         (*load)(userptr,"vkGetPhysicalDeviceExternalBufferProperties");
    glad_vkGetPhysicalDeviceExternalFenceProperties =
         (PFN_vkGetPhysicalDeviceExternalFenceProperties)
         (*load)(userptr,"vkGetPhysicalDeviceExternalFenceProperties");
    glad_vkGetPhysicalDeviceExternalSemaphoreProperties =
         (PFN_vkGetPhysicalDeviceExternalSemaphoreProperties)
         (*load)(userptr,"vkGetPhysicalDeviceExternalSemaphoreProperties");
    glad_vkGetPhysicalDeviceFeatures2 =
         (PFN_vkGetPhysicalDeviceFeatures2)(*load)(userptr,"vkGetPhysicalDeviceFeatures2");
    glad_vkGetPhysicalDeviceFormatProperties2 =
         (PFN_vkGetPhysicalDeviceFormatProperties2)
         (*load)(userptr,"vkGetPhysicalDeviceFormatProperties2");
    glad_vkGetPhysicalDeviceImageFormatProperties2 =
         (PFN_vkGetPhysicalDeviceImageFormatProperties2)
         (*load)(userptr,"vkGetPhysicalDeviceImageFormatProperties2");
    glad_vkGetPhysicalDeviceMemoryProperties2 =
         (PFN_vkGetPhysicalDeviceMemoryProperties2)
         (*load)(userptr,"vkGetPhysicalDeviceMemoryProperties2");
    glad_vkGetPhysicalDeviceProperties2 =
         (PFN_vkGetPhysicalDeviceProperties2)(*load)(userptr,"vkGetPhysicalDeviceProperties2");
    glad_vkGetPhysicalDeviceQueueFamilyProperties2 =
         (PFN_vkGetPhysicalDeviceQueueFamilyProperties2)
         (*load)(userptr,"vkGetPhysicalDeviceQueueFamilyProperties2");
    glad_vkGetPhysicalDeviceSparseImageFormatProperties2 =
         (PFN_vkGetPhysicalDeviceSparseImageFormatProperties2)
         (*load)(userptr,"vkGetPhysicalDeviceSparseImageFormatProperties2");
    glad_vkTrimCommandPool = (PFN_vkTrimCommandPool)(*load)(userptr,"vkTrimCommandPool");
    glad_vkUpdateDescriptorSetWithTemplate =
         (PFN_vkUpdateDescriptorSetWithTemplate)(*load)(userptr,"vkUpdateDescriptorSetWithTemplate")
    ;
  }
  local_388 = 0;
  local_384 = 0;
  bVar1 = true;
  if ((glad_vkEnumerateInstanceExtensionProperties ==
       (PFN_vkEnumerateInstanceExtensionProperties)0x0) ||
     ((physical_device != (VkPhysicalDevice)0x0 &&
      (glad_vkEnumerateDeviceExtensionProperties == (PFN_vkEnumerateDeviceExtensionProperties)0x0)))
     ) {
    local_380 = 0;
    __ptr_00 = (VkExtensionProperties *)0x0;
    goto LAB_001072e4;
  }
  VVar2 = (*glad_vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,&local_388,(VkExtensionProperties *)0x0);
  if ((VVar2 == VK_SUCCESS) &&
     ((physical_device == (VkPhysicalDevice)0x0 ||
      (VVar2 = (*glad_vkEnumerateDeviceExtensionProperties)
                         (physical_device,(char *)0x0,&local_384,(VkExtensionProperties *)0x0),
      VVar2 == VK_SUCCESS)))) {
    local_380 = (ulong)(local_384 + local_388);
    if (local_384 + local_388 == 0) {
      local_380 = 0;
      __ptr_00 = (VkExtensionProperties *)0x0;
      bVar1 = true;
      goto LAB_001072e4;
    }
    uVar3 = local_384;
    if (local_384 < local_388) {
      uVar3 = local_388;
    }
    __ptr = (VkExtensionProperties *)malloc((ulong)uVar3 * 0x104);
    pVVar11 = (VkExtensionProperties *)0x0;
    if ((__ptr == (VkExtensionProperties *)0x0) ||
       (VVar2 = (*glad_vkEnumerateInstanceExtensionProperties)((char *)0x0,&local_388,__ptr),
       VVar2 != VK_SUCCESS)) {
LAB_00107767:
      free(__ptr);
      if (pVVar11 == (VkExtensionProperties *)0x0) goto LAB_001072dd;
      iVar4 = (int)local_380;
      local_380 = 0;
      uVar9 = 0;
      do {
        free(*(void **)(pVVar11->extensionName + uVar9 * 8));
        uVar9 = uVar9 + 1;
      } while (iVar4 + (uint)(iVar4 == 0) != uVar9);
      bVar1 = true;
      __ptr_00 = (VkExtensionProperties *)0x0;
      __ptr = pVVar11;
    }
    else {
      __ptr_00 = (VkExtensionProperties *)calloc(local_380 & 0xffffffff,8);
      if (__ptr_00 == (VkExtensionProperties *)0x0) {
        pVVar11 = (VkExtensionProperties *)0x0;
        goto LAB_00107767;
      }
      local_378 = (ulong)local_388;
      local_370 = physical_device;
      pVVar11 = __ptr_00;
      if (local_378 != 0) {
        uVar9 = 0;
        __src = __ptr;
        do {
          memcpy(&local_368,__src,0x104);
          sVar5 = strlen((char *)&local_368);
          pvVar6 = malloc(sVar5 + 1);
          *(void **)(__ptr_00->extensionName + uVar9 * 8) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00107767;
          memcpy(pvVar6,&local_368,sVar5 + 1);
          uVar9 = uVar9 + 1;
          __src = __src + 1;
        } while (local_378 != uVar9);
      }
      if (local_370 == (VkPhysicalDevice)0x0) {
LAB_001077c8:
        bVar1 = false;
      }
      else {
        VVar2 = (*glad_vkEnumerateDeviceExtensionProperties)(local_370,(char *)0x0,&local_384,__ptr)
        ;
        if (VVar2 != VK_SUCCESS) goto LAB_00107767;
        if ((ulong)local_384 == 0) goto LAB_001077c8;
        local_378 = (ulong)local_384 * 0x104;
        uVar9 = 0;
        uVar3 = local_388;
        do {
          memcpy(&local_368,__ptr->extensionName + uVar9,0x104);
          sVar5 = strlen((char *)&local_368);
          pvVar6 = malloc(sVar5 + 1);
          *(void **)(__ptr_00->extensionName + (ulong)uVar3 * 8) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00107767;
          memcpy(pvVar6,&local_368,sVar5 + 1);
          uVar9 = uVar9 + 0x104;
          uVar3 = uVar3 + 1;
          bVar1 = false;
        } while (local_378 != uVar9);
      }
    }
    free(__ptr);
  }
  else {
LAB_001072dd:
    __ptr_00 = (VkExtensionProperties *)0x0;
    bVar1 = true;
    local_380 = 0;
  }
LAB_001072e4:
  iVar4 = 0;
  if (!bVar1) {
    uVar9 = local_380 & 0xffffffff;
    if ((int)local_380 == 0) {
      GLAD_VK_EXT_debug_report = 0;
      GLAD_VK_KHR_surface = 0;
    }
    else {
      uVar10 = 0;
      do {
        if ((*(char **)(__ptr_00->extensionName + uVar10 * 8) != (char *)0x0) &&
           (iVar4 = strcmp("VK_EXT_debug_report",*(char **)(__ptr_00->extensionName + uVar10 * 8)),
           iVar4 == 0)) {
          GLAD_VK_EXT_debug_report = 1;
          goto LAB_0010733e;
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      GLAD_VK_EXT_debug_report = 0;
LAB_0010733e:
      uVar10 = 0;
      do {
        if ((*(char **)(__ptr_00->extensionName + uVar10 * 8) != (char *)0x0) &&
           (iVar4 = strcmp("VK_KHR_surface",*(char **)(__ptr_00->extensionName + uVar10 * 8)),
           iVar4 == 0)) {
          GLAD_VK_KHR_surface = 1;
          goto LAB_0010737a;
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      GLAD_VK_KHR_surface = 0;
    }
LAB_0010737a:
    if ((int)local_380 == 0) {
      GLAD_VK_KHR_swapchain = 0;
    }
    else {
      uVar10 = 0;
      do {
        if ((*(char **)(__ptr_00->extensionName + uVar10 * 8) != (char *)0x0) &&
           (iVar4 = strcmp("VK_KHR_swapchain",*(char **)(__ptr_00->extensionName + uVar10 * 8)),
           iVar4 == 0)) {
          GLAD_VK_KHR_swapchain = 1;
          goto LAB_001073c1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      GLAD_VK_KHR_swapchain = 0;
LAB_001073c1:
      if ((int)local_380 != 0) {
        uVar10 = 0;
        do {
          free(*(void **)(__ptr_00->extensionName + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    free(__ptr_00);
    if (GLAD_VK_EXT_debug_report != 0) {
      glad_vkCreateDebugReportCallbackEXT =
           (PFN_vkCreateDebugReportCallbackEXT)(*load)(userptr,"vkCreateDebugReportCallbackEXT");
      glad_vkDebugReportMessageEXT =
           (PFN_vkDebugReportMessageEXT)(*load)(userptr,"vkDebugReportMessageEXT");
      glad_vkDestroyDebugReportCallbackEXT =
           (PFN_vkDestroyDebugReportCallbackEXT)(*load)(userptr,"vkDestroyDebugReportCallbackEXT");
    }
    if (GLAD_VK_KHR_surface != 0) {
      glad_vkDestroySurfaceKHR = (PFN_vkDestroySurfaceKHR)(*load)(userptr,"vkDestroySurfaceKHR");
      glad_vkGetPhysicalDeviceSurfaceCapabilitiesKHR =
           (PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
           (*load)(userptr,"vkGetPhysicalDeviceSurfaceCapabilitiesKHR");
      glad_vkGetPhysicalDeviceSurfaceFormatsKHR =
           (PFN_vkGetPhysicalDeviceSurfaceFormatsKHR)
           (*load)(userptr,"vkGetPhysicalDeviceSurfaceFormatsKHR");
      glad_vkGetPhysicalDeviceSurfacePresentModesKHR =
           (PFN_vkGetPhysicalDeviceSurfacePresentModesKHR)
           (*load)(userptr,"vkGetPhysicalDeviceSurfacePresentModesKHR");
      glad_vkGetPhysicalDeviceSurfaceSupportKHR =
           (PFN_vkGetPhysicalDeviceSurfaceSupportKHR)
           (*load)(userptr,"vkGetPhysicalDeviceSurfaceSupportKHR");
    }
    iVar4 = iVar8;
    if (GLAD_VK_KHR_swapchain != 0) {
      glad_vkAcquireNextImage2KHR =
           (PFN_vkAcquireNextImage2KHR)(*load)(userptr,"vkAcquireNextImage2KHR");
      glad_vkAcquireNextImageKHR =
           (PFN_vkAcquireNextImageKHR)(*load)(userptr,"vkAcquireNextImageKHR");
      glad_vkCreateSwapchainKHR = (PFN_vkCreateSwapchainKHR)(*load)(userptr,"vkCreateSwapchainKHR");
      glad_vkDestroySwapchainKHR =
           (PFN_vkDestroySwapchainKHR)(*load)(userptr,"vkDestroySwapchainKHR");
      glad_vkGetDeviceGroupPresentCapabilitiesKHR =
           (PFN_vkGetDeviceGroupPresentCapabilitiesKHR)
           (*load)(userptr,"vkGetDeviceGroupPresentCapabilitiesKHR");
      glad_vkGetDeviceGroupSurfacePresentModesKHR =
           (PFN_vkGetDeviceGroupSurfacePresentModesKHR)
           (*load)(userptr,"vkGetDeviceGroupSurfacePresentModesKHR");
      glad_vkGetPhysicalDevicePresentRectanglesKHR =
           (PFN_vkGetPhysicalDevicePresentRectanglesKHR)
           (*load)(userptr,"vkGetPhysicalDevicePresentRectanglesKHR");
      glad_vkGetSwapchainImagesKHR =
           (PFN_vkGetSwapchainImagesKHR)(*load)(userptr,"vkGetSwapchainImagesKHR");
      glad_vkQueuePresentKHR = (PFN_vkQueuePresentKHR)(*load)(userptr,"vkQueuePresentKHR");
    }
  }
  return iVar4;
}

Assistant:

int gladLoadVulkanUserPtr( VkPhysicalDevice physical_device, GLADuserptrloadfunc load, void *userptr) {
    int version;

#ifdef VK_VERSION_1_1
    glad_vkEnumerateInstanceVersion  = (PFN_vkEnumerateInstanceVersion) load(userptr, "vkEnumerateInstanceVersion");
#endif
    version = glad_vk_find_core_vulkan( physical_device);
    if (!version) {
        return 0;
    }

    glad_vk_load_VK_VERSION_1_0(load, userptr);
    glad_vk_load_VK_VERSION_1_1(load, userptr);

    if (!glad_vk_find_extensions_vulkan( physical_device)) return 0;
    glad_vk_load_VK_EXT_debug_report(load, userptr);
    glad_vk_load_VK_KHR_surface(load, userptr);
    glad_vk_load_VK_KHR_swapchain(load, userptr);


    return version;
}